

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O3

void __thiscall
asio::detail::executor_function::
executor_function<asio::detail::binder1<std::_Bind<void(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener*,std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>,std::error_code>,std::allocator<void>>
          (executor_function *this,
          binder1<std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_std::error_code>
          *f,allocator<void> *a)

{
  _func_void_impl_base_ptr_bool *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  error_category *peVar4;
  impl_base *piVar5;
  undefined8 uVar6;
  long *in_FS_OFFSET;
  ptr local_28;
  
  if (*(long *)(*in_FS_OFFSET + -8) == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -8) + 8);
  }
  local_28.a = a;
  piVar5 = (impl_base *)
           thread_info_base::allocate<asio::detail::thread_info_base::executor_function_tag>
                     (uVar6,0x58,8);
  local_28.p = (impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
                *)0x0;
  p_Var1 = *(_func_void_impl_base_ptr_bool **)&(f->handler_).field_0x8;
  piVar5[1].complete_ = (_func_void_impl_base_ptr_bool *)(f->handler_)._M_f;
  piVar5[2].complete_ = p_Var1;
  piVar5[4].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  p_Var1 = (_func_void_impl_base_ptr_bool *)
           (f->handler_)._M_bound_args.
           super__Tuple_impl<0UL,_nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
           .
           super__Tuple_impl<1UL,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
           .super__Tuple_impl<2UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
           super__Head_base<2UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
           super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(f->handler_)._M_bound_args.
                   super__Tuple_impl<0UL,_nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
                   .
                   super__Tuple_impl<1UL,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
                   .
                   super__Tuple_impl<2UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
                   .super__Head_base<2UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl
           + 8))->_M_pi;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(f->handler_)._M_bound_args.
          super__Tuple_impl<0UL,_nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
          .
          super__Tuple_impl<1UL,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
          .super__Tuple_impl<2UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
          super__Head_base<2UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl + 8))->
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piVar5[3].complete_ = p_Var1;
  piVar5[4].complete_ = (_func_void_impl_base_ptr_bool *)p_Var2;
  (f->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
  .
  super__Tuple_impl<1UL,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
  .super__Tuple_impl<2UL,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>.
  super__Head_base<2UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
  super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  piVar5[6].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  peVar3 = (f->handler_)._M_bound_args.
           super__Tuple_impl<0UL,_nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
           .
           super__Tuple_impl<1UL,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
           .super__Head_base<1UL,_std::shared_ptr<nuraft::asio_rpc_listener>,_false>._M_head_impl.
           super___shared_ptr<nuraft::asio_rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(f->handler_)._M_bound_args.
                   super__Tuple_impl<0UL,_nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
                   .
                   super__Tuple_impl<1UL,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
                   .super__Head_base<1UL,_std::shared_ptr<nuraft::asio_rpc_listener>,_false>.
                   _M_head_impl.
                   super___shared_ptr<nuraft::asio_rpc_listener,_(__gnu_cxx::_Lock_policy)2> + 8))->
           _M_pi;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(f->handler_)._M_bound_args.
          super__Tuple_impl<0UL,_nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
          .
          super__Tuple_impl<1UL,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
          .super__Head_base<1UL,_std::shared_ptr<nuraft::asio_rpc_listener>,_false>._M_head_impl.
          super___shared_ptr<nuraft::asio_rpc_listener,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piVar5[5].complete_ = (_func_void_impl_base_ptr_bool *)peVar3;
  piVar5[6].complete_ = (_func_void_impl_base_ptr_bool *)p_Var2;
  (f->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
  .
  super__Tuple_impl<1UL,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
  .super__Head_base<1UL,_std::shared_ptr<nuraft::asio_rpc_listener>,_false>._M_head_impl.
  super___shared_ptr<nuraft::asio_rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  piVar5[7].complete_ =
       (_func_void_impl_base_ptr_bool *)
       (f->handler_)._M_bound_args.
       super__Tuple_impl<0UL,_nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
       .super__Head_base<0UL,_nuraft::asio_rpc_listener_*,_false>._M_head_impl;
  peVar4 = (f->arg1_)._M_cat;
  piVar5[8].complete_ = *(_func_void_impl_base_ptr_bool **)&f->arg1_;
  piVar5[9].complete_ = (_func_void_impl_base_ptr_bool *)peVar4;
  piVar5->complete_ =
       complete<asio::detail::binder1<std::_Bind<void(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener*,std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>,std::error_code>,std::allocator<void>>
  ;
  this->impl_ = piVar5;
  local_28.v = (void *)0x0;
  impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_28);
  return;
}

Assistant:

explicit executor_function(F f, const Alloc& a)
  {
    // Allocate and construct an object to wrap the function.
    typedef impl<F, Alloc> impl_type;
    typename impl_type::ptr p = {
      detail::addressof(a), impl_type::ptr::allocate(a), 0 };
    impl_ = new (p.v) impl_type(ASIO_MOVE_CAST(F)(f), a);
    p.v = 0;
  }